

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

int anon_unknown.dwarf_618e2::HandleCppLint
              (string *runCmd,string *sourceFile,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *param_3)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  string stdOut;
  int ret;
  cmList cpplint_cmd;
  string local_50;
  int local_2c;
  cmList local_28;
  
  cmList::cmList(&local_28,runCmd,Yes,Yes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_28.Values,sourceFile);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar1 = cmSystemTools::RunSingleCommand
                    (&local_28.Values,&local_50,&local_50,&local_2c,(char *)0x0,OUTPUT_NONE,
                     (cmDuration)0x0,Auto);
  if (bVar1) {
    iVar3 = 0;
    if (local_50._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: cpplint diagnostics:\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
      iVar3 = 0;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error running \'",0xf)
    ;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        ((local_28.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_28.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\': ",3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
    iVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28.Values);
  return iVar3;
}

Assistant:

int HandleCppLint(const std::string& runCmd, const std::string& sourceFile,
                  const std::vector<std::string>&)
{
  // Construct the cpplint command line.
  cmList cpplint_cmd{ runCmd, cmList::EmptyElements::Yes };
  cpplint_cmd.push_back(sourceFile);

  // Run the cpplint command line.  Capture its output.
  std::string stdOut;
  int ret;
  if (!cmSystemTools::RunSingleCommand(cpplint_cmd, &stdOut, &stdOut, &ret,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    std::cerr << "Error running '" << cpplint_cmd[0] << "': " << stdOut
              << "\n";
    return 1;
  }
  if (!stdOut.empty()) {
    std::cerr << "Warning: cpplint diagnostics:\n";
    // Output the output from cpplint to stderr
    std::cerr << stdOut;
  }

  // always return 0 so the build can continue as cpplint returns non-zero
  // for any warning
  return 0;
}